

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CXMLReaderImpl.h
# Opt level: O2

float __thiscall
irr::io::CXMLReaderImpl<char,_irr::io::IXMLBase>::getAttributeValueAsFloat
          (CXMLReaderImpl<char,_irr::io::IXMLBase> *this,int idx)

{
  int iVar1;
  undefined4 extraout_var;
  undefined4 in_register_00000034;
  float fVar2;
  double dVar3;
  stringc c;
  string<char> local_18;
  
  iVar1 = (*(this->super_IIrrXMLReader<char,_irr::io::IXMLBase>)._vptr_IIrrXMLReader[6])
                    (this,CONCAT44(in_register_00000034,idx));
  if ((char *)CONCAT44(extraout_var,iVar1) == (char *)0x0) {
    fVar2 = 0.0;
  }
  else {
    core::string<char>::string<char>(&local_18,(char *)CONCAT44(extraout_var,iVar1));
    dVar3 = atof(local_18.array);
    fVar2 = (float)dVar3;
    core::string<char>::~string(&local_18);
  }
  return fVar2;
}

Assistant:

float getAttributeValueAsFloat(int idx) const
	{
		const char_type* attrvalue = getAttributeValue(idx);
		if (!attrvalue)
			return 0;

		core::stringc c = attrvalue;
        return static_cast<float>(atof(c.c_str()));
		//return fast_atof(c.c_str());
	}